

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::anon_unknown_1::FunctionCase::logSingleOperationCalculationInfo
          (FunctionCase *this)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  int local_1a8 [4];
  MessageBuilder local_198;
  int local_14;
  FunctionCase *pFStack_10;
  int numFunctionCalls;
  FunctionCase *this_local;
  
  local_14 = 4;
  pFStack_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_OperatorPerformanceCase).super_TestCase.super_TestNode.m_testCtx
                      );
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [15])"Note: program ");
  local_1a8[0] = 0;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1a8);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [11])0x2b97164);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_14);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])" calls to \'");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_func);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [26])"\' in one loop iteration; ");
  pMVar1 = tcu::MessageBuilder::operator<<
                     (pMVar1,(char (*) [40])"cost of one operation is calculated as ");
  pMVar1 = tcu::MessageBuilder::operator<<
                     (pMVar1,(char (*) [66])
                             "(cost_of_workload_with_calls - cost_of_workload_without_calls) / ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_14);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return;
}

Assistant:

void FunctionCase::logSingleOperationCalculationInfo (void) const
{
	const int numFunctionCalls = FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS;

	m_testCtx.getLog() << TestLog::Message << "Note: program " << (int)PROGRAM_WITH_FUNCTION_CALLS << " contains "
										   << numFunctionCalls << " calls to '" << m_func << "' in one loop iteration; "
										   << "cost of one operation is calculated as "
										   << "(cost_of_workload_with_calls - cost_of_workload_without_calls) / " << numFunctionCalls << TestLog::EndMessage;
}